

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_message.hpp
# Opt level: O0

iuStreamMessage * __thiscall
iutest::detail::iuStreamMessage::operator<<(iuStreamMessage *this,char (*value) [16])

{
  string local_38;
  char (*local_18) [16];
  char (*value_local) [16];
  iuStreamMessage *this_local;
  
  local_18 = value;
  value_local = (char (*) [16])this;
  PrintToString<char[16]>(&local_38,value);
  std::operator<<((ostream *)&(this->m_stream).super_iu_stringstream.field_0x10,(string *)&local_38)
  ;
  std::__cxx11::string::~string((string *)&local_38);
  return this;
}

Assistant:

iuStreamMessage& operator << (const T(&value)[SIZE])
    {
        m_stream << PrintToString(value);
        return *this;
    }